

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTestGroup::init
          (AtomicCounterTestGroup *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Context *pCVar2;
  long lVar3;
  TestNode *pTVar4;
  long *plVar5;
  long *plVar6;
  ulong *puVar7;
  uint uVar8;
  int iVar9;
  string name;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  long local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  char *local_38;
  
  pTVar4 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar4,pCVar2->m_testCtx,"resource_list","Resource list");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4[1].m_testCtx = (TestContext *)0x0;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterCase_02160950;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar2->m_testCtx,"active_variables","Active variables");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4[1].m_testCtx = (TestContext *)0x0;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterCase_021609f0;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar4,pCVar2->m_testCtx,"buffer_binding","Buffer binding");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4[1].m_testCtx = (TestContext *)0x0;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterCase_02160a40;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar4,pCVar2->m_testCtx,"buffer_data_size","Buffer binding");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4[1].m_testCtx = (TestContext *)0x0;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterCase_02160a90;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x90);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar2->m_testCtx,"referenced_by_compute",
             glcts::fixed_sample_locations_values + 1);
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterReferencedByCase_02160ae0;
  *(undefined1 *)&pTVar4[1].m_testCtx = 0;
  *(undefined8 *)((long)&pTVar4[1].m_testCtx + 4) = 0x2000000020;
  pTVar4[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x90);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar2->m_testCtx,"referenced_by_separable_vertex",
             glcts::fixed_sample_locations_values + 1);
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterReferencedByCase_02160ae0;
  *(undefined1 *)&pTVar4[1].m_testCtx = 1;
  *(undefined1 **)((long)&pTVar4[1].m_testCtx + 4) = &DAT_100000001;
  pTVar4[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x90);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar2->m_testCtx,"referenced_by_separable_fragment",
             glcts::fixed_sample_locations_values + 1);
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterReferencedByCase_02160ae0;
  *(undefined1 *)&pTVar4[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar4[1].m_testCtx + 4) = 0x200000002;
  pTVar4[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x90);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar2->m_testCtx,"referenced_by_separable_geometry",
             glcts::fixed_sample_locations_values + 1);
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterReferencedByCase_02160ae0;
  *(undefined1 *)&pTVar4[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar4[1].m_testCtx + 4) = 0x400000004;
  pTVar4[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x90);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar2->m_testCtx,"referenced_by_separable_tess_ctrl",
             glcts::fixed_sample_locations_values + 1);
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterReferencedByCase_02160ae0;
  *(undefined1 *)&pTVar4[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar4[1].m_testCtx + 4) = 0x800000008;
  pTVar4[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x90);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar2->m_testCtx,"referenced_by_separable_tess_eval",
             glcts::fixed_sample_locations_values + 1);
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterReferencedByCase_02160ae0;
  *(undefined1 *)&pTVar4[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar4[1].m_testCtx + 4) = 0x1000000010;
  pTVar4[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  local_80 = 0;
  do {
    pTVar4 = (TestNode *)operator_new(0x90);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_98 = 0;
    local_90 = local_90 & 0xffffffffffffff00;
    local_a0 = &local_90;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
    lVar3 = local_80;
    local_e0 = &local_d0;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_d0 = *plVar6;
      lStack_c8 = plVar5[3];
    }
    else {
      local_d0 = *plVar6;
      local_e0 = (long *)*plVar5;
    }
    local_d8 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_38 = init::pipelines[local_80].name;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
    local_c0 = &local_b0;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_b0 = *plVar6;
      lStack_a8 = plVar5[3];
    }
    else {
      local_b0 = *plVar6;
      local_c0 = (long *)*plVar5;
    }
    local_b8 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    uVar1 = init::pipelines[lVar3].flags;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)local_c0,
               glcts::fixed_sample_locations_values + 1);
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterReferencedByCase_02160ae0;
    *(undefined1 *)&pTVar4[1].m_testCtx = 0;
    *(uint *)((long)&pTVar4[1].m_testCtx + 4) = uVar1;
    *(uint *)&pTVar4[1].m_name._M_dataplus._M_p = uVar1;
    pTVar4[1].m_name._M_string_length = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    iVar9 = 0;
    do {
      uVar8 = 1 << ((byte)iVar9 & 0x1f);
      if (uVar1 < uVar8) break;
      if ((uVar8 & uVar1) != 0) {
        local_58 = &local_48;
        local_50 = 0;
        local_48 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
        local_78 = &local_68;
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_68 = *plVar6;
          lStack_60 = plVar5[3];
        }
        else {
          local_68 = *plVar6;
          local_78 = (long *)*plVar5;
        }
        local_70 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
        puVar7 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar7) {
          local_90 = *puVar7;
          lStack_88 = plVar5[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *puVar7;
          local_a0 = (ulong *)*plVar5;
        }
        local_98 = plVar5[1];
        *plVar5 = (long)puVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
        local_e0 = &local_d0;
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_d0 = *plVar6;
          lStack_c8 = plVar5[3];
        }
        else {
          local_d0 = *plVar6;
          local_e0 = (long *)*plVar5;
        }
        local_d8 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
        local_c0 = &local_b0;
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_b0 = *plVar6;
          lStack_a8 = plVar5[3];
        }
        else {
          local_b0 = *plVar6;
          local_c0 = (long *)*plVar5;
        }
        local_b8 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,local_d0 + 1);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if (local_58 != &local_48) {
          operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
        }
        pTVar4 = (TestNode *)operator_new(0x90);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)local_c0,
                   glcts::fixed_sample_locations_values + 1);
        pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
        pTVar4->_vptr_TestNode = (_func_int **)&PTR__AtomicCounterReferencedByCase_02160ae0;
        *(undefined1 *)&pTVar4[1].m_testCtx = 0;
        *(uint *)((long)&pTVar4[1].m_testCtx + 4) = uVar1;
        *(uint *)&pTVar4[1].m_name._M_dataplus._M_p = uVar8;
        pTVar4[1].m_name._M_string_length = 0;
        tcu::TestNode::addChild((TestNode *)this,pTVar4);
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != 6);
    local_80 = local_80 + 1;
    if (local_80 == 4) {
      return uVar1;
    }
  } while( true );
}

Assistant:

void AtomicCounterTestGroup::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	flags;
	} pipelines[] =
	{
		{
			"vertex_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT)
		},
		{
			"vertex_tess_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION)
		},
		{
			"vertex_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_GEOMETRY)
		},
		{
			"vertex_tess_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION) | (1 << glu::SHADERTYPE_GEOMETRY),
		},
	};

	// .resource_list
	addChild(new AtomicCounterResourceListCase(m_context, "resource_list", "Resource list"));

	// .active_variables
	addChild(new AtomicCounterActiveVariablesCase(m_context, "active_variables", "Active variables"));

	// .buffer_binding
	addChild(new AtomicCounterBufferBindingCase(m_context, "buffer_binding", "Buffer binding"));

	// .buffer_data_size
	addChild(new AtomicCounterBufferDataSizeCase(m_context, "buffer_data_size", "Buffer binding"));

	// .referenced_by
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_compute",				"",	false,	(1 << glu::SHADERTYPE_COMPUTE),										(1 << glu::SHADERTYPE_COMPUTE)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_vertex",		"",	true,	(1 << glu::SHADERTYPE_VERTEX),										(1 << glu::SHADERTYPE_VERTEX)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_fragment",	"",	true,	(1 << glu::SHADERTYPE_FRAGMENT),									(1 << glu::SHADERTYPE_FRAGMENT)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_geometry",	"",	true,	(1 << glu::SHADERTYPE_GEOMETRY),									(1 << glu::SHADERTYPE_GEOMETRY)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_tess_ctrl",	"",	true,	(1 << glu::SHADERTYPE_TESSELLATION_CONTROL),						(1 << glu::SHADERTYPE_TESSELLATION_CONTROL)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_tess_eval",	"",	true,	(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),						(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION)));

	for (int pipelineNdx = 0; pipelineNdx < DE_LENGTH_OF_ARRAY(pipelines); ++pipelineNdx)
	{
		addChild(new AtomicCounterReferencedByCase(m_context, (std::string() + "referenced_by_" + pipelines[pipelineNdx].name).c_str(), "", false, pipelines[pipelineNdx].flags, pipelines[pipelineNdx].flags));

		for (deUint32 stageNdx = 0; stageNdx < glu::SHADERTYPE_LAST; ++stageNdx)
		{
			const deUint32 currentBit = (1u << stageNdx);
			if (currentBit > pipelines[pipelineNdx].flags)
				break;
			if (currentBit & pipelines[pipelineNdx].flags)
			{
				const char*			stageName	= (stageNdx == glu::SHADERTYPE_VERTEX)					? ("vertex")
												: (stageNdx == glu::SHADERTYPE_FRAGMENT)				? ("fragment")
												: (stageNdx == glu::SHADERTYPE_GEOMETRY)				? ("geo")
												: (stageNdx == glu::SHADERTYPE_TESSELLATION_CONTROL)	? ("tess_ctrl")
												: (stageNdx == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? ("tess_eval")
												: (DE_NULL);
				const std::string	name		= std::string() + "referenced_by_" + pipelines[pipelineNdx].name + "_only_" + stageName;

				addChild(new AtomicCounterReferencedByCase(m_context, name.c_str(), "", false, pipelines[pipelineNdx].flags, currentBit));
			}
		}
	}
}